

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserSamTest_ParseWhole_Test::~BioparserSamTest_ParseWhole_Test
          (BioparserSamTest_ParseWhole_Test *this)

{
  BioparserSamTest_ParseWhole_Test *this_local;
  
  ~BioparserSamTest_ParseWhole_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserSamTest, ParseWhole) {
  Setup("sample.sam");
  o = p->Parse(-1);
  Check();
}